

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool ON_ChangeRationalNurbsCurveEndWeights
               (int dim,int order,int cv_count,int cvstride,double *cv,double *knot,double w0,
               double w1)

{
  int cv_dim;
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  
  bVar3 = ON_IsValid(w0);
  if (bVar3) {
    bVar3 = ON_IsValid(w1);
    if ((w1 == 0.0) && (!NAN(w1))) {
      return false;
    }
    if ((w0 == 0.0) && (!NAN(w0))) {
      return false;
    }
    if (!bVar3) {
      return false;
    }
    if (((0.0 <= w0) || (w1 <= 0.0)) && ((w0 <= 0.0 || (0.0 <= w1)))) {
      cv_dim = dim + 1;
      bVar3 = ON_ClampKnotVector(cv_dim,order,cv_count,cvstride,cv,knot,2);
      if (bVar3) {
        dVar8 = cv[dim];
        iVar4 = (cv_count + -1) * cvstride + dim;
        dVar1 = cv[iVar4];
        bVar3 = ON_IsValid(dVar8);
        if (bVar3) {
          bVar3 = ON_IsValid(dVar1);
          if ((dVar8 == 0.0) && (!NAN(dVar8))) {
            return false;
          }
          if (!bVar3) {
            return false;
          }
          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
            return false;
          }
          if (((0.0 <= dVar8) || (dVar1 <= 0.0)) && ((dVar8 <= 0.0 || (0.0 <= dVar1)))) {
            auVar9._8_8_ = w1;
            auVar9._0_8_ = w0;
            auVar2._8_8_ = dVar1;
            auVar2._0_8_ = dVar8;
            auVar10 = divpd(auVar9,auVar2);
            dVar11 = auVar10._8_8_;
            dVar8 = auVar10._0_8_;
            if (ABS(dVar8 - dVar11) <= ABS(dVar11) * 1.490116119385e-08) {
              auVar10._0_8_ =
                   ~-(ulong)(dVar8 != dVar11) & (ulong)dVar11 |
                   (ulong)((dVar8 + dVar11) * 0.5) & -(ulong)(dVar8 != dVar11);
              auVar10._8_8_ = auVar10._0_8_;
            }
            dVar8 = auVar10._8_8_;
            if ((dVar8 != 1.0) || (NAN(dVar8))) {
              if ((dVar1 != w1) || (NAN(dVar1) || NAN(w1))) {
                iVar5 = cv_count;
                while (bVar3 = iVar5 != 0, iVar5 = iVar5 + -1, bVar3) {
                  lVar6 = (long)cv_dim * 8 + (long)cvstride * -8;
                  for (lVar7 = 0; cv_dim != (int)lVar7; lVar7 = lVar7 + 1) {
                    cv[lVar7] = cv[lVar7] * dVar8;
                    lVar6 = lVar6 + -8;
                  }
                  cv = (double *)((long)cv - lVar6);
                }
                cv = cv + -(long)(cvstride * cv_count);
              }
            }
            if ((auVar10._0_8_ != dVar8) || (NAN(auVar10._0_8_) || NAN(dVar8))) {
              dVar8 = cv[dim];
              dVar1 = cv[iVar4];
              bVar3 = ON_IsValid(dVar8);
              if (bVar3) {
                bVar3 = ON_IsValid(dVar1);
                if (((dVar8 != 0.0) || (NAN(dVar8))) && (bVar3)) {
                  dVar8 = pow(w0 / dVar8,1.0 / (double)(order + -1));
                  bVar3 = ON_IsValid(dVar8);
                  if (!bVar3) {
                    return false;
                  }
                  bVar3 = ON_ReparameterizeRationalNurbsCurve
                                    (dVar8,dim,order,cv_count,cvstride,cv,knot);
                  if (!bVar3) {
                    return false;
                  }
                }
              }
            }
            cv[dim] = w0;
            cv[iVar4] = w1;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_ChangeRationalNurbsCurveEndWeights(
          int dim, 
          int order, 
          int cv_count,
          int cvstride, 
          double* cv, 
          double* knot,
          double w0, 
          double w1
          )
{
  double r, s, v0, v1;
  int i, j;

  if ( !ON_IsValid(w0) || !ON_IsValid(w1) || 0.0 == w0 || 0.0 == w1 )
    return false;
  if ( (w0 < 0.0 && w1 > 0.0) || (w0 > 0.0 && w1 < 0.0) )
    return false;

  if ( !ON_ClampKnotVector( dim+1, order, cv_count, cvstride, cv, knot, 2 ) )
    return false;

  v0 = cv[dim];
  v1 = cv[cvstride*(cv_count-1)+dim];
  if (!ON_IsValid(v0) || !ON_IsValid(v1) || v0 == 0.0 || v1 == 0.0)
    return false;
  if (v0 < 0.0 && v1 > 0.0)
    return false;
  if ( v0 > 0.0 && v1 < 0.0)
    return false;

  r = w0/v0;
  s = w1/v1;
  if ( fabs(r-s) <= fabs(s)*ON_SQRT_EPSILON )
  {
    // simply scale
    if ( r != s )
      s = 0.5*(r+s);
    r = s;
  }

  if ( 1.0 != s && v1 != w1 )
  {
    // scale to get last weight set to w1
    dim++;
    cvstride -= dim;
    i = cv_count;
    while(i--)
    {
      j = dim;
      while(j--)
        *cv++ *= s;
      cv += cvstride;
    }
    cvstride += dim;
    dim--;
    cv -= cvstride*cv_count;
  }

  if ( r != s )
  {
    v0 = cv[dim];
    v1 = cv[cvstride*(cv_count-1)+dim];
    if ( ON_IsValid(v0) && ON_IsValid(v1) && 0.0 != v0 )
    {
      // need to scale and reparameterize
      r = pow(w0/v0,1.0/((double)(order-1)));
      if ( !ON_IsValid(r) )
        return false;
      if ( !ON_ReparameterizeRationalNurbsCurve(r,dim,order,cv_count,cvstride,cv,knot) )
        return false;
    }
  }

  // make sure weights agree to the last bit! 
  cv[dim] = w0;
  cv[cvstride*(cv_count-1)+dim] = w1;

  return true;
}